

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O0

void __thiscall cppcms::cache_interface::cache_interface(cache_interface *this,context *context)

{
  cache_pool *this_00;
  cache_pool *this_01;
  undefined8 in_RSI;
  noncopyable *in_RDI;
  noncopyable *this_02;
  
  booster::noncopyable::noncopyable(in_RDI);
  booster::hold_ptr<cppcms::cache_interface::_data>::hold_ptr
            ((hold_ptr<cppcms::cache_interface::_data> *)in_RDI);
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  this_02 = in_RDI + 0x10;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x41036d);
  std::
  set<cppcms::triggers_recorder_*,_std::less<cppcms::triggers_recorder_*>,_std::allocator<cppcms::triggers_recorder_*>_>
  ::set((set<cppcms::triggers_recorder_*,_std::less<cppcms::triggers_recorder_*>,_std::allocator<cppcms::triggers_recorder_*>_>
         *)0x410380);
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)(in_RDI + 0x70));
  in_RDI[0x78] = (noncopyable)((byte)in_RDI[0x78] & 0xfe);
  this_00 = (cache_pool *)http::context::service((context *)0x4103ac);
  this_01 = service::cache_pool((service *)0x4103bd);
  cache_pool::get(this_00);
  booster::intrusive_ptr<cppcms::impl::base_cache>::operator=
            ((intrusive_ptr<cppcms::impl::base_cache> *)this_02,
             (intrusive_ptr<cppcms::impl::base_cache> *)this_00);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)this_01);
  return;
}

Assistant:

cache_interface::cache_interface(http::context &context) :
	context_(&context),
	page_compression_used_(0)
{
	cache_module_ = context_->service().cache_pool().get();
}